

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::PropertyTable::PropertyTable
          (PropertyTable *this,Element *element,
          shared_ptr<const_Assimp::FBX::PropertyTable> *templateProps)

{
  Element *pEVar1;
  bool bVar2;
  Scope *this_00;
  ElementMap *this_01;
  long lVar3;
  mapped_type *ppEVar4;
  Element *element_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  iterator local_f0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>
  local_e8;
  iterator local_e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>
  local_d8;
  const_iterator it;
  string local_c8;
  string local_a8;
  key_type *local_88;
  string *name;
  string local_78;
  reference local_58;
  value_type *v;
  const_iterator __end2;
  const_iterator __begin2;
  ElementMap *__range2;
  Scope *scope;
  shared_ptr<const_Assimp::FBX::PropertyTable> *templateProps_local;
  Element *element_local;
  PropertyTable *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
  ::map(&this->lazyProps);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*>_>_>
  ::map(&this->props);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->templateProps,templateProps);
  this->element = element;
  this_00 = GetRequiredScope(element);
  this_01 = Scope::Elements_abi_cxx11_(this_00);
  __end2 = std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
           ::begin(this_01);
  v = (value_type *)
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
      ::end(this_01);
  while (bVar2 = std::operator!=(&__end2,(_Self *)&v), bVar2) {
    local_58 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
               ::operator*(&__end2);
    bVar2 = std::operator!=(&local_58->first,"P");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"expected only P elements in property table",
                 (allocator<char> *)((long)&name + 7));
      Util::DOMWarning(&local_78,local_58->second);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&name + 7));
    }
    else {
      (anonymous_namespace)::PeekPropertyName_abi_cxx11_
                (&local_a8,(_anonymous_namespace_ *)local_58->second,element_00);
      local_88 = &local_a8;
      lVar3 = std::__cxx11::string::length();
      if (lVar3 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"could not read property name",
                   (allocator<char> *)((long)&it._M_node + 7));
        Util::DOMWarning(&local_c8,local_58->second);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
        it._M_node._0_4_ = 3;
      }
      else {
        local_e0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
             ::find(&this->lazyProps,local_88);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>
        ::_Rb_tree_const_iterator(&local_d8,&local_e0);
        local_f0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
             ::end(&this->lazyProps);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>
        ::_Rb_tree_const_iterator(&local_e8,&local_f0);
        bVar2 = std::operator!=(&local_d8,&local_e8);
        if (bVar2) {
          std::operator+(&local_110,"duplicate property name, will hide previous value: ",local_88);
          Util::DOMWarning(&local_110,local_58->second);
          std::__cxx11::string::~string((string *)&local_110);
          it._M_node._0_4_ = 3;
        }
        else {
          pEVar1 = local_58->second;
          ppEVar4 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
                    ::operator[](&this->lazyProps,local_88);
          *ppEVar4 = pEVar1;
          it._M_node._0_4_ = 0;
        }
      }
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

PropertyTable::PropertyTable(const Element& element, std::shared_ptr<const PropertyTable> templateProps)
: templateProps(templateProps)
, element(&element)
{
    const Scope& scope = GetRequiredScope(element);
    for(const ElementMap::value_type& v : scope.Elements()) {
        if(v.first != "P") {
            DOMWarning("expected only P elements in property table",v.second);
            continue;
        }

        const std::string& name = PeekPropertyName(*v.second);
        if(!name.length()) {
            DOMWarning("could not read property name",v.second);
            continue;
        }

        LazyPropertyMap::const_iterator it = lazyProps.find(name);
        if (it != lazyProps.end()) {
            DOMWarning("duplicate property name, will hide previous value: " + name,v.second);
            continue;
        }

        lazyProps[name] = v.second;
    }
}